

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O0

bool __thiscall
wasm::StackIROptimizer::canRemoveSetGetPair(StackIROptimizer *this,Index setIndex,Index getIndex)

{
  initializer_list<bool> __l;
  bool bVar1;
  reference ppSVar2;
  size_type sVar3;
  LocalGet *pLVar4;
  ulong uVar5;
  reference rVar6;
  LocalGet *otherGet;
  _Bit_type local_f0;
  reference local_e8;
  LocalSet *local_d8;
  LocalSet *otherSet;
  _Bit_type local_c8;
  reference local_c0;
  reference local_b0;
  undefined4 local_9c;
  StackInst *local_98;
  StackInst *inst;
  int local_88;
  Index i;
  Index covers;
  allocator<bool> local_72;
  bool local_71;
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  vector<bool,_std::allocator<bool>_> coverStack;
  Type TStack_30;
  Index currDepth;
  Type localType;
  LocalSet *set;
  Index getIndex_local;
  Index setIndex_local;
  StackIROptimizer *this_local;
  
  if (getIndex <= setIndex) {
    __assert_fail("setIndex < getIndex",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                  ,0x1a0,"bool wasm::StackIROptimizer::canRemoveSetGetPair(Index, Index)");
  }
  ppSVar2 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                      (this->insts,(ulong)setIndex);
  localType.id = (uintptr_t)Expression::cast<wasm::LocalSet>((*ppSVar2)->origin);
  TStack_30 = Function::getLocalType(this->func,((LocalSet *)localType.id)->index);
  bVar1 = wasm::Type::isSingle(&stack0xffffffffffffffd0);
  if (!bVar1) {
    __assert_fail("localType.isSingle()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                  ,0x1a7,"bool wasm::StackIROptimizer::canRemoveSetGetPair(Index, Index)");
  }
  bVar1 = Function::isParam(this->func,*(Index *)(localType.id + 0x10));
  if ((bVar1) || (bVar1 = wasm::Type::isNonNullable(&stack0xffffffffffffffd0), !bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    local_71 = false;
    local_70 = &local_71;
    local_68 = 1;
    std::allocator<bool>::allocator(&local_72);
    __l._M_len = local_68;
    __l._M_array = local_70;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_60,__l,&local_72);
    std::allocator<bool>::~allocator(&local_72);
    local_88 = 0;
    inst._4_4_ = setIndex + 1;
    while( true ) {
      uVar5 = (ulong)inst._4_4_;
      sVar3 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::size(this->insts);
      if (sVar3 <= uVar5) break;
      ppSVar2 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                          (this->insts,(ulong)inst._4_4_);
      local_98 = *ppSVar2;
      if (local_98 != (StackInst *)0x0) {
        bVar1 = isControlFlowBegin(this,local_98);
        if (bVar1) {
          coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage._4_4_ =
               coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage._4_4_ + 1;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)local_60,false);
        }
        else {
          bVar1 = isControlFlowEnd(this,local_98);
          if (bVar1) {
            if (coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage._4_4_ == 0) {
              this_local._7_1_ = true;
              goto LAB_02671382;
            }
            coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage._4_4_ =
                 coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage._4_4_ + -1;
            rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                              ((vector<bool,_std::allocator<bool>_> *)local_60);
            local_b0 = rVar6;
            bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_b0);
            if (bVar1) {
              local_88 = local_88 + -1;
            }
            std::vector<bool,_std::allocator<bool>_>::pop_back
                      ((vector<bool,_std::allocator<bool>_> *)local_60);
          }
          else {
            bVar1 = isControlFlowBarrier(this,local_98);
            if (bVar1) {
              if (coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage._4_4_ == 0) {
                this_local._7_1_ = true;
                goto LAB_02671382;
              }
              rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                                ((vector<bool,_std::allocator<bool>_> *)local_60);
              local_c0 = rVar6;
              bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_c0);
              if (bVar1) {
                local_88 = local_88 + -1;
              }
              rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                                ((vector<bool,_std::allocator<bool>_> *)local_60);
              local_c8 = rVar6._M_mask;
              otherSet = (LocalSet *)rVar6._M_p;
              std::_Bit_reference::operator=((_Bit_reference *)&otherSet,false);
            }
            else {
              local_d8 = Expression::dynCast<wasm::LocalSet>(local_98->origin);
              if (local_d8 == (LocalSet *)0x0) {
                pLVar4 = Expression::dynCast<wasm::LocalGet>(local_98->origin);
                if ((((pLVar4 != (LocalGet *)0x0) &&
                     (pLVar4->index == *(Index *)(localType.id + 0x10))) && (inst._4_4_ != getIndex)
                    ) && (local_88 == 0)) {
                  this_local._7_1_ = false;
                  goto LAB_02671382;
                }
              }
              else if (local_d8->index == *(Index *)(localType.id + 0x10)) {
                rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                                  ((vector<bool,_std::allocator<bool>_> *)local_60);
                local_e8 = rVar6;
                bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_e8);
                if (((bVar1 ^ 0xffU) & 1) != 0) {
                  local_88 = local_88 + 1;
                  if (coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage._4_4_ == 0) {
                    this_local._7_1_ = true;
                    goto LAB_02671382;
                  }
                  rVar6 = std::vector<bool,_std::allocator<bool>_>::back
                                    ((vector<bool,_std::allocator<bool>_> *)local_60);
                  local_f0 = rVar6._M_mask;
                  otherGet = (LocalGet *)rVar6._M_p;
                  std::_Bit_reference::operator=((_Bit_reference *)&otherGet,true);
                }
              }
            }
          }
        }
      }
      inst._4_4_ = inst._4_4_ + 1;
    }
    this_local._7_1_ = true;
LAB_02671382:
    local_9c = 1;
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_60);
  }
  return this_local._7_1_;
}

Assistant:

bool StackIROptimizer::canRemoveSetGetPair(Index setIndex, Index getIndex) {
  // The set must be before the get.
  assert(setIndex < getIndex);

  auto* set = insts[setIndex]->origin->cast<LocalSet>();
  auto localType = func->getLocalType(set->index);
  // Note we do not need to handle tuples here, as the parent ignores them
  // anyhow (hence we can check non-nullability instead of non-
  // defaultability).
  assert(localType.isSingle());
  if (func->isParam(set->index) || !localType.isNonNullable()) {
    // This local cannot pose a problem for validation (params are always
    // initialized, and it is ok if nullable locals are uninitialized).
    return true;
  }

  // Track the depth (in block/if/loop/etc. scopes) relative to our starting
  // point. Anything less deep than that is not interesting, as we can only
  // help things at our depth or deeper to validate.
  Index currDepth = 0;

  // Look for a different get than the one in getIndex (since that one is
  // being removed) which would stop validating without the set. While doing
  // so, note other sets that ensure validation even if our set is removed. We
  // track those in this stack of booleans, one for each scope, which is true
  // if another sets covers us and ours is not needed.
  //
  // We begin in the current scope and with no other set covering us.
  std::vector<bool> coverStack = {false};

  // Track the total number of covers as well, for quick checking below.
  Index covers = 0;

  // TODO: We could look before us as well, but then we might end up scanning
  //       much of the function every time.
  for (Index i = setIndex + 1; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst) {
      continue;
    }
    if (isControlFlowBegin(inst)) {
      // A new scope begins.
      currDepth++;
      coverStack.push_back(false);
    } else if (isControlFlowEnd(inst)) {
      if (currDepth == 0) {
        // Less deep than the start, so we found no problem.
        return true;
      }
      currDepth--;

      if (coverStack.back()) {
        // A cover existed in the scope which ended.
        covers--;
      }
      coverStack.pop_back();
    } else if (isControlFlowBarrier(inst)) {
      // A barrier, like the else in an if-else, not only ends a scope but
      // opens a new one.
      if (currDepth == 0) {
        // Another scope with the same depth begins, but ours ended, so stop.
        return true;
      }

      if (coverStack.back()) {
        // A cover existed in the scope which ended.
        covers--;
      }
      coverStack.back() = false;
    } else if (auto* otherSet = inst->origin->dynCast<LocalSet>()) {
      // We are covered in this scope henceforth.
      if (otherSet->index == set->index) {
        if (!coverStack.back()) {
          covers++;
          if (currDepth == 0) {
            // We have a cover at depth 0, so everything from here on out
            // will be covered.
            return true;
          }
          coverStack.back() = true;
        }
      }
    } else if (auto* otherGet = inst->origin->dynCast<LocalGet>()) {
      if (otherGet->index == set->index && i != getIndex && !covers) {
        // We found a get that might be a problem: it uses the same index, but
        // is not the get we were told about, and no other set covers us.
        return false;
      }
    }
  }

  // No problem.
  return true;
}